

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void __thiscall iqnet::ssl::LockContainer::~LockContainer(LockContainer *this)

{
  mutex *pmVar1;
  __pthread_internal_list *p_Var2;
  long lVar3;
  
  pmVar1 = this->locks;
  if (pmVar1 != (mutex *)0x0) {
    p_Var2 = pmVar1[-1].m.__data.__list.__next;
    if (p_Var2 != (__pthread_internal_list *)0x0) {
      lVar3 = (long)p_Var2 * 0x28;
      do {
        boost::mutex::~mutex((mutex *)((long)&pmVar1[-1].m + lVar3));
        lVar3 = lVar3 + -0x28;
      } while (lVar3 != 0);
    }
    operator_delete__((void *)((long)&pmVar1[-1].m + 0x20),(long)p_Var2 * 0x28 + 8);
    return;
  }
  return;
}

Assistant:

LockContainer::~LockContainer()
{
   if (CRYPTO_get_locking_callback() == &openssl_lock_callback)
    CRYPTO_set_locking_callback(0);

#ifndef _WIN32
  if (CRYPTO_get_id_callback() == &openssl_id_function)
    CRYPTO_set_id_callback(0);
#endif

  // do not try to unlock locks
  delete[] locks;
}